

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

int SSL_set_cipher_list(SSL *s,char *str)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  SSL_METHOD *pSVar4;
  
  pSVar4 = s->method;
  if (pSVar4 == (SSL_METHOD *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar1 = *(ushort *)((long)&pSVar4[1].ssl_accept + 5);
    if ((uVar1 >> 0xb & 1) == 0) {
      uVar3 = EVP_has_aes_hardware();
      pSVar4 = s->method;
    }
    else {
      uVar3 = uVar1 >> 0xc & 1;
    }
    bVar2 = bssl::ssl_create_cipher_list
                      ((UniquePtr<SSLCipherPreferenceList> *)&pSVar4->ssl_free,uVar3 != 0,str,false)
    ;
    uVar3 = (uint)bVar2;
  }
  return uVar3;
}

Assistant:

int SSL_set_cipher_list(SSL *ssl, const char *str) {
  if (!ssl->config) {
    return 0;
  }
  const bool has_aes_hw = ssl->config->aes_hw_override
                              ? ssl->config->aes_hw_override_value
                              : EVP_has_aes_hardware();
  return ssl_create_cipher_list(&ssl->config->cipher_list, has_aes_hw, str,
                                false /* not strict */);
}